

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_classtrait.cpp
# Opt level: O1

void __thiscall
pfederc::Parser::parseClassTraitBody
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  size_t *psVar1;
  size_t sVar2;
  Token *pTVar3;
  size_t sVar4;
  size_t sVar5;
  Lexer *pLVar6;
  bool bVar7;
  _List_node_base *p_Var8;
  pointer *__ptr;
  pointer __p;
  Lexer *pLVar9;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> funcExpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  _Head_base<0UL,_pfederc::FuncExpr_*,_false> local_68;
  Lexer *local_60;
  Error<pfederc::SyntaxErrorCode> *local_58;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *local_50;
  undefined1 local_48 [16];
  
  bVar7 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
  if (bVar7) {
    do {
      bVar7 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
      if (!bVar7) {
        return;
      }
      bVar7 = Token::operator==(this->lexer->currentToken,TOK_EOL);
      if (bVar7) {
        Lexer::next(this->lexer);
      }
      else {
        parseExpression((Parser *)&local_60,(Precedence)this);
        pLVar9 = local_60;
        if (local_60 != (Lexer *)0x0) {
          if (*(ExprType *)&(local_60->filePath)._M_dataplus._M_p == EXPR_FUNC) {
            local_60 = (Lexer *)0x0;
            if ((_List_node_base *)((Expr *)&pLVar9->_vptr_Lexer)->_vptr_Expr !=
                (_List_node_base *)&PTR__FuncExpr_0012b790) {
              pLVar9 = (Lexer *)0x0;
            }
            local_68._M_head_impl = (FuncExpr *)pLVar9;
            if ((pLVar9->lineIndices).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
              local_58 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
              sVar4 = ((Position *)&(pLVar9->filePath)._M_string_length)->line;
              sVar5 = (pLVar9->filePath).field_2._M_allocated_capacity;
              sVar2 = *(size_t *)((long)&(pLVar9->filePath).field_2 + 8);
              local_58->logLevel = LVL_ERROR;
              local_58->err = STX_ERR_TRAITCLASS_SCOPE_FUNC_BODY;
              (local_58->pos).line = sVar4;
              (local_58->pos).startIndex = sVar5;
              (local_58->pos).endIndex = sVar2;
              (local_58->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (local_58->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (local_58->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_50 = functions;
              generateError((Parser *)&stack0xffffffffffffffc8,
                            (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                             *)this);
              std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
              ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>
                           *)&stack0xffffffffffffffc8);
              functions = local_50;
              if (local_58 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
                std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                          ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_58,
                           local_58);
                functions = local_50;
              }
            }
            p_Var8 = (_List_node_base *)operator_new(0x18);
            p_Var8[1]._M_next = (_List_node_base *)local_68._M_head_impl;
            local_68._M_head_impl = (FuncExpr *)0x0;
            std::__detail::_List_node_base::_M_hook(p_Var8);
            psVar1 = &(functions->
                      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                      ((unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
                       &local_68);
          }
          else if (local_60 != (Lexer *)0x0) {
            local_68._M_head_impl = (FuncExpr *)operator_new(0x38);
            sVar4 = ((Position *)&(pLVar9->filePath)._M_string_length)->line;
            pLVar6 = (Lexer *)(pLVar9->filePath).field_2._M_allocated_capacity;
            sVar2 = *(size_t *)((long)&(pLVar9->filePath).field_2 + 8);
            *(Level *)&((local_68._M_head_impl)->super_Expr)._vptr_Expr = LVL_ERROR;
            *(SyntaxErrorCode *)((long)&((local_68._M_head_impl)->super_Expr)._vptr_Expr + 4) =
                 STX_ERR_TRAIT_SCOPE;
            ((Position *)&((local_68._M_head_impl)->super_Expr).parent)->line = sVar4;
            ((local_68._M_head_impl)->super_Expr).lexer = pLVar6;
            *(size_t *)&((local_68._M_head_impl)->super_Expr).type = sVar2;
            (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
             &((local_68._M_head_impl)->super_Expr).pos.line)->_M_impl).super__Vector_impl_data.
            _M_start = (pointer)0x0;
            ((local_68._M_head_impl)->super_Expr).pos.startIndex = 0;
            ((local_68._M_head_impl)->super_Expr).pos.endIndex = 0;
            generateError((Parser *)(local_48 + 8),
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                        (local_48 + 8));
            if (local_68._M_head_impl != (FuncExpr *)0x0) {
              std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                        ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_68,
                         (Error<pfederc::SyntaxErrorCode> *)local_68._M_head_impl);
            }
          }
        }
        bVar7 = expect(this,TOK_EOL);
        if (!bVar7) {
          pTVar3 = this->lexer->currentToken;
          local_68._M_head_impl = (FuncExpr *)operator_new(0x38);
          sVar4 = (pTVar3->pos).line;
          pLVar9 = (Lexer *)(pTVar3->pos).startIndex;
          sVar2 = (pTVar3->pos).endIndex;
          *(Level *)&((local_68._M_head_impl)->super_Expr)._vptr_Expr = LVL_ERROR;
          *(SyntaxErrorCode *)((long)&((local_68._M_head_impl)->super_Expr)._vptr_Expr + 4) =
               STX_ERR_EXPECTED_EOL;
          ((Position *)&((local_68._M_head_impl)->super_Expr).parent)->line = sVar4;
          ((local_68._M_head_impl)->super_Expr).lexer = pLVar9;
          *(size_t *)&((local_68._M_head_impl)->super_Expr).type = sVar2;
          (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
           &((local_68._M_head_impl)->super_Expr).pos.line)->_M_impl).super__Vector_impl_data.
          _M_start = (pointer)0x0;
          ((local_68._M_head_impl)->super_Expr).pos.startIndex = 0;
          ((local_68._M_head_impl)->super_Expr).pos.endIndex = 0;
          generateError((Parser *)local_48,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     local_48);
          if (local_68._M_head_impl != (FuncExpr *)0x0) {
            std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                      ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_68,
                       (Error<pfederc::SyntaxErrorCode> *)local_68._M_head_impl);
          }
          skipToStmtEol(this);
        }
        if (local_60 != (Lexer *)0x0) {
          (*(code *)((_List_node_base *)((Expr *)&local_60->_vptr_Lexer)->_vptr_Expr)->_M_prev)();
        }
      }
      bVar7 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
    } while (bVar7);
  }
  return;
}

Assistant:

void Parser::parseClassTraitBody(bool &err,
    std::list<std::unique_ptr<FuncExpr>> &functions) noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (expr && expr->getType() == ExprType::EXPR_FUNC) {
      std::unique_ptr<FuncExpr> funcExpr(
            dynamic_cast<FuncExpr*>(expr.release()));

      /*if (funcExpr->getTemplates()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAIT_SCOPE_FUNC_TEMPL,
              std::get<0>(funcExpr->getTemplates()->front())->getPosition()
              + std::get<1>(funcExpr->getTemplates()->back())->getPosition()));
      }*/

      if (!funcExpr->getBody()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAITCLASS_SCOPE_FUNC_BODY,
              funcExpr->getPosition()));
      }

      functions.push_back(std::move(funcExpr));
    } else if (expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR, 
            SyntaxErrorCode::STX_ERR_TRAIT_SCOPE, expr->getPosition()));
      // soft error
    }

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      // soft error
      skipToStmtEol();
    }
  }
}